

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  byte *pbVar1;
  Fts3Table *pTab;
  Fts3PhraseToken *pFVar2;
  Fts3MultiSegReader *pCsr_00;
  sqlite3_stmt *pStmt_00;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Fts3DeferredToken *pFVar6;
  Mem *pVal;
  byte *pbVar7;
  long lVar8;
  Fts3TokenAndCost *pFVar9;
  byte *pbVar10;
  long lVar11;
  int iVar12;
  Fts3TokenAndCost *pFVar13;
  int iVar14;
  uchar *pStart;
  byte bVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  long in_FS_OFFSET;
  Fts3Table *p;
  int nList;
  sqlite3_stmt *pStmt;
  int local_7c;
  int local_44;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTab = (Fts3Table *)(pCsr->base).pVtab;
  iVar14 = 0;
  if ((pTab->zContentTbl != (char *)0x0) || (iVar14 = 0, nTC < 1)) goto LAB_001ca9ba;
  lVar8 = 0;
  iVar17 = 0;
  iVar12 = 0;
  do {
    if (*(Fts3Expr **)((long)&aTC->pRoot + lVar8) == pRoot) {
      iVar12 = iVar12 + *(int *)((long)&aTC->nOvfl + lVar8);
      iVar17 = iVar17 + 1;
    }
    lVar8 = lVar8 + 0x28;
  } while ((ulong)(uint)nTC * 0x28 != lVar8);
  iVar14 = 0;
  if (iVar17 < 2 || iVar12 == 0) goto LAB_001ca9ba;
  local_7c = pCsr->nRowAvg;
  iVar14 = 0;
  if (local_7c == 0) {
    local_40 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
    iVar14 = sqlite3Fts3SelectDoctotal(pTab,&local_40);
    pStmt_00 = local_40;
    if (iVar14 != 0) goto LAB_001ca9ba;
    pVal = columnMem(local_40,0);
    pbVar7 = (byte *)sqlite3_value_blob(pVal);
    columnMallocFailure(pStmt_00);
    if (pbVar7 != (byte *)0x0) {
      lVar8 = 0;
      iVar14 = sqlite3_column_bytes(pStmt_00,0);
      pbVar1 = pbVar7 + iVar14;
      iVar12 = (int)pbVar7 + 10;
      uVar5 = 0xfffffffffffffff9;
      pbVar10 = pbVar7;
      do {
        if (pbVar1 <= pbVar10) {
LAB_001cad52:
          iVar12 = (int)pbVar10 + 1;
          break;
        }
        uVar5 = uVar5 + 7;
        lVar8 = lVar8 + ((ulong)(*pbVar10 & 0x7f) << ((byte)uVar5 & 0x3f));
        if (-1 < (char)*pbVar10) goto LAB_001cad52;
        pbVar10 = pbVar10 + 1;
      } while (uVar5 < 0x39);
      lVar11 = (long)(iVar12 - (int)pbVar7);
      if (lVar11 < iVar14) {
        pbVar7 = pbVar7 + lVar11;
        do {
          iVar14 = (int)pbVar7 + 10;
          uVar5 = 0xfffffffffffffff9;
          lVar11 = 0;
          pbVar10 = pbVar7;
          do {
            if (pbVar1 <= pbVar10) {
LAB_001cada3:
              iVar14 = (int)pbVar10 + 1;
              break;
            }
            uVar5 = uVar5 + 7;
            lVar11 = lVar11 + ((ulong)(*pbVar10 & 0x7f) << ((byte)uVar5 & 0x3f));
            if (-1 < (char)*pbVar10) goto LAB_001cada3;
            pbVar10 = pbVar10 + 1;
          } while (uVar5 < 0x39);
          pbVar7 = pbVar7 + (iVar14 - (int)pbVar7);
        } while (pbVar7 < pbVar1);
        if ((lVar8 != 0) && (lVar11 != 0)) {
          pCsr->nDoc = lVar8;
          pCsr->nRowAvg = (int)((lVar11 / lVar8 + (long)pTab->nPgsz) / (long)pTab->nPgsz);
          iVar14 = sqlite3_reset(pStmt_00);
          local_7c = pCsr->nRowAvg;
          goto LAB_001caa5b;
        }
      }
    }
    sqlite3_reset(pStmt_00);
    iVar14 = 0x10b;
  }
  else {
LAB_001caa5b:
    if (iVar14 == 0) {
      iVar12 = 0;
      iVar18 = 1;
      uVar19 = 0;
      do {
        if (nTC < 1) {
          pFVar13 = (Fts3TokenAndCost *)0x0;
        }
        else {
          pFVar13 = (Fts3TokenAndCost *)0x0;
          uVar5 = (ulong)(uint)nTC;
          pFVar9 = aTC;
          do {
            if (((pFVar9->pToken != (Fts3PhraseToken *)0x0) && (pFVar9->pRoot == pRoot)) &&
               ((pFVar13 == (Fts3TokenAndCost *)0x0 || (pFVar9->nOvfl < pFVar13->nOvfl)))) {
              pFVar13 = pFVar9;
            }
            pFVar9 = pFVar9 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        if (uVar19 == 0) {
          iVar18 = iVar18 << 2;
LAB_001cab20:
          local_44 = 0;
          local_40 = (sqlite3_stmt *)0x0;
          iVar14 = fts3TermSelect(pTab,pFVar13->pToken,pFVar13->iCol,&local_44,(char **)&local_40);
          if ((iVar14 == 0) &&
             (iVar14 = fts3EvalPhraseMergeToken
                                 (pTab,pFVar13->pPhrase,pFVar13->iToken,(char *)local_40,local_44),
             iVar14 == 0)) {
            pbVar7 = (byte *)(pFVar13->pPhrase->doclist).aAll;
            iVar14 = 0;
            iVar4 = 0;
            if ((pbVar7 != (byte *)0x0) &&
               (lVar8 = (long)(pFVar13->pPhrase->doclist).nAll, 0 < lVar8)) {
              iVar4 = 0;
              pbVar1 = pbVar7;
              do {
                do {
                  pbVar10 = pbVar1;
                  pbVar1 = pbVar10 + 1;
                } while ((char)*pbVar10 < '\0');
                bVar15 = pbVar10[1];
                if (bVar15 != 0) {
                  do {
                    pbVar1 = pbVar10 + 2;
                    bVar16 = bVar15 & 0x80;
                    pbVar10 = pbVar10 + 1;
                    bVar15 = *pbVar1;
                  } while (bVar16 != 0 || *pbVar1 != 0);
                }
                iVar4 = iVar4 + 1;
                pbVar1 = pbVar10 + 2;
              } while (pbVar10 + 2 < pbVar7 + lVar8);
            }
            if (iVar4 < iVar12) {
              iVar12 = iVar4;
            }
            if (uVar19 == 0) {
              iVar12 = iVar4;
            }
          }
        }
        else {
          iVar14 = iVar18 + 3;
          if (-1 < iVar18) {
            iVar14 = iVar18;
          }
          if (pFVar13->nOvfl < ((iVar12 + (iVar14 >> 2) + -1) / (iVar14 >> 2)) * local_7c) {
            if (uVar19 < 0xc) {
              iVar18 = iVar18 * 4;
            }
            iVar14 = 0;
            if (uVar19 != iVar17 - 1U && 1 < pFVar13->pPhrase->nToken) goto LAB_001cab20;
          }
          else {
            pFVar2 = pFVar13->pToken;
            iVar4 = pFVar13->iCol;
            iVar3 = sqlite3_initialize();
            iVar14 = 7;
            if ((iVar3 == 0) &&
               (pFVar6 = (Fts3DeferredToken *)sqlite3Malloc(0x20),
               pFVar6 != (Fts3DeferredToken *)0x0)) {
              pFVar6->pToken = (Fts3PhraseToken *)0x0;
              *(undefined8 *)&pFVar6->iCol = 0;
              pFVar6->pNext = (Fts3DeferredToken *)0x0;
              pFVar6->pList = (PendingList *)0x0;
              pFVar6->pToken = pFVar2;
              pFVar6->pNext = pCsr->pDeferred;
              pFVar6->iCol = iVar4;
              pCsr->pDeferred = pFVar6;
              pFVar2->pDeferred = pFVar6;
              iVar14 = 0;
            }
            pCsr_00 = pFVar2->pSegcsr;
            sqlite3Fts3SegReaderFinish(pCsr_00);
            sqlite3_free(pCsr_00);
            pFVar2->pSegcsr = (Fts3MultiSegReader *)0x0;
          }
        }
        pFVar13->pToken = (Fts3PhraseToken *)0x0;
        uVar19 = uVar19 + 1;
      } while (((int)uVar19 < iVar17) && (iVar14 == 0));
    }
  }
LAB_001ca9ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar14;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order
  ** of the number of overflow pages that will be loaded by the pager layer
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl)
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}